

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

void green_poller_dump(green_poller_t poller)

{
  green_future_t pgVar1;
  uint uVar2;
  size_t sVar3;
  double dVar4;
  
  fprintf(_stderr,"poller @ 0x%p, size=%zu, used=%zu, busy=%zu:\n",poller,poller->size,poller->used,
          poller->busy);
  dVar4 = log10(((double)CONCAT44(0x45300000,(int)(poller->size >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)poller->size) - 4503599627370496.0));
  dVar4 = ceil(dVar4);
  if (poller->size != 0) {
    uVar2 = (uint)dVar4;
    sVar3 = 0;
    do {
      pgVar1 = poller->futures[sVar3];
      if (sVar3 == 0) {
        fwrite("  --busy--\n",0xb,1,_stderr);
      }
      if (sVar3 == poller->busy) {
        fwrite("  --done--\n",0xb,1,_stderr);
      }
      if (sVar3 == poller->used) {
        fwrite("  --free--\n",0xb,1,_stderr);
      }
      if (pgVar1 == (green_future_t)0x0) {
        fprintf(_stderr,"  %*zu => null\n",(ulong)uVar2,sVar3);
      }
      else {
        fprintf(_stderr,"  %*zu => (%*d) %p (%s)\n",(ulong)uVar2,sVar3,(ulong)uVar2,
                (ulong)(uint)pgVar1->slot,pgVar1,
                green_poller_dump_states_rel +
                *(int *)(green_poller_dump_states_rel + (ulong)pgVar1->state * 4));
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < poller->size);
  }
  fwrite("  --------\n",0xb,1,_stderr);
  return;
}

Assistant:

static void green_poller_dump(green_poller_t poller)
{
    static const char* states[] = {
        "pending",
        "aborted",
        "complete",
    };
    fprintf(stderr, "poller @ 0x%p, size=%zu, used=%zu, busy=%zu:\n",
            poller, poller->size, poller->used, poller->busy);
    int w = (int)ceil(log10((double)poller->size));
    for (size_t i = 0; (i < poller->size); ++i) {
        green_future_t f = poller->futures[i];
        if (i == 0) {
            fprintf(stderr, "  --busy--\n");
        }
        if (i == poller->busy) {
            fprintf(stderr, "  --done--\n");
        }
        if (i == poller->used) {
            fprintf(stderr, "  --free--\n");
        }
        if (f) {
            fprintf(stderr, "  %*zu => (%*d) %p (%s)\n",
                    w, i, w, f->slot, f, states[f->state]);
        }
        else {
            fprintf(stderr, "  %*zu => null\n", w, i);
        }
    }
    fprintf(stderr, "  --------\n");
}